

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O2

int __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::listen
          (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this,int __fd,int __n)

{
  int extraout_EAX;
  error_code ec;
  error_code local_28;
  
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  detail::reactive_socket_service_base::listen
            (&((this->impl_).service_)->super_reactive_socket_service_base,(int)this + 8,__fd);
  detail::throw_error(&local_28,"listen");
  return extraout_EAX;
}

Assistant:

void listen(int backlog = socket_base::max_listen_connections)
  {
    asio::error_code ec;
    impl_.get_service().listen(impl_.get_implementation(), backlog, ec);
    asio::detail::throw_error(ec, "listen");
  }